

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O0

double HTS_set_default_duration(size_t *duration,double *mean,double *vari,size_t size)

{
  double dVar1;
  undefined1 auVar2 [16];
  size_t sum;
  double temp;
  size_t i;
  size_t size_local;
  double *vari_local;
  double *mean_local;
  size_t *duration_local;
  
  sum = 0;
  for (i = 0; i < size; i = i + 1) {
    dVar1 = mean[i] + 0.5;
    if (1.0 <= dVar1) {
      duration[i] = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
    }
    else {
      duration[i] = 1;
    }
    sum = duration[i] + sum;
  }
  auVar2._8_4_ = (int)(sum >> 0x20);
  auVar2._0_8_ = sum;
  auVar2._12_4_ = 0x45300000;
  return (auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sum) - 4503599627370496.0);
}

Assistant:

static double HTS_set_default_duration(size_t * duration, double *mean, double *vari, size_t size)
{
   size_t i;
   double temp;
   size_t sum = 0;

   for (i = 0; i < size; i++) {
      temp = mean[i] + 0.5;
      if (temp < 1.0)
         duration[i] = 1;
      else
         duration[i] = (size_t) temp;
      sum += duration[i];
   }

   return (double) sum;
}